

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSim.c
# Opt level: O0

void Ssw_SmlSimulateOneFrame(Ssw_Sml_t *p)

{
  Vec_Ptr_t *p_00;
  int iVar1;
  abctime aVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pIn;
  abctime aVar4;
  abctime clk;
  int i;
  Aig_Obj_t *pObjLo;
  Aig_Obj_t *pObjLi;
  Aig_Obj_t *pObj;
  Ssw_Sml_t *p_local;
  
  aVar2 = Abc_Clock();
  for (clk._4_4_ = 0; iVar1 = Vec_PtrSize(p->pAig->vObjs), clk._4_4_ < iVar1;
      clk._4_4_ = clk._4_4_ + 1) {
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p->pAig->vObjs,clk._4_4_);
    if ((pAVar3 != (Aig_Obj_t *)0x0) && (iVar1 = Aig_ObjIsNode(pAVar3), iVar1 != 0)) {
      Ssw_SmlNodeSimulate(p,pAVar3,0);
    }
  }
  for (clk._4_4_ = 0; iVar1 = Saig_ManRegNum(p->pAig), clk._4_4_ < iVar1; clk._4_4_ = clk._4_4_ + 1)
  {
    p_00 = p->pAig->vCos;
    iVar1 = Saig_ManPoNum(p->pAig);
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p_00,clk._4_4_ + iVar1);
    Ssw_SmlNodeCopyFanin(p,pAVar3,0);
  }
  for (clk._4_4_ = 0; iVar1 = Saig_ManRegNum(p->pAig), clk._4_4_ < iVar1; clk._4_4_ = clk._4_4_ + 1)
  {
    pAVar3 = Saig_ManLi(p->pAig,clk._4_4_);
    pIn = Saig_ManLo(p->pAig,clk._4_4_);
    Ssw_SmlNodeTransferNext(p,pAVar3,pIn,0);
  }
  aVar4 = Abc_Clock();
  p->timeSim = (aVar4 - aVar2) + p->timeSim;
  p->nSimRounds = p->nSimRounds + 1;
  return;
}

Assistant:

void Ssw_SmlSimulateOneFrame( Ssw_Sml_t * p )
{
    Aig_Obj_t * pObj, * pObjLi, * pObjLo;
    int i;
    abctime clk;
clk = Abc_Clock();
    // simulate the nodes
    Aig_ManForEachNode( p->pAig, pObj, i )
        Ssw_SmlNodeSimulate( p, pObj, 0 );
    // copy simulation info into outputs
    Saig_ManForEachLi( p->pAig, pObj, i )
        Ssw_SmlNodeCopyFanin( p, pObj, 0 );
    // copy simulation info into the inputs
    Saig_ManForEachLiLo( p->pAig, pObjLi, pObjLo, i )
        Ssw_SmlNodeTransferNext( p, pObjLi, pObjLo, 0 );
p->timeSim += Abc_Clock() - clk;
p->nSimRounds++;
}